

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_warp.c
# Opt level: O1

uint32 fe_warp_id(melfb_t *mel)

{
  uint uVar1;
  uint uVar2;
  uint32 uVar3;
  
  uVar1 = mel->warp_id;
  if ((ulong)uVar1 < 3) {
    uVar2 = (*(code *)(&PTR_fe_warp_inverse_linear_id_0016cd30)[(ulong)uVar1 * 7])();
    if (uVar1 != uVar2) {
      __assert_fail("mel->warp_id == fe_warp_conf[mel->warp_id].id()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp.c"
                    ,0xac,"uint32 fe_warp_id(melfb_t *)");
    }
    uVar3 = mel->warp_id;
  }
  else {
    uVar3 = 0xffffffff;
    if (uVar1 != 0xffffffff) {
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fe/fe_warp.c"
              ,0xb2,"fe_warp module misconfigured with invalid fe_warp_id %u\n",(ulong)uVar1);
      exit(1);
    }
  }
  return uVar3;
}

Assistant:

uint32
fe_warp_id(melfb_t *mel)
{
    if (mel->warp_id <= FE_WARP_ID_MAX) {
        assert(mel->warp_id == fe_warp_conf[mel->warp_id].id());
        return mel->warp_id;
    }
    else if (mel->warp_id != FE_WARP_ID_NONE) {
        E_FATAL
            ("fe_warp module misconfigured with invalid fe_warp_id %u\n",
             mel->warp_id);
    }

    return FE_WARP_ID_NONE;
}